

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O3

void __thiscall
TEST_ScoringTableTest_NonDealerSelfDrawn_Test::testBody
          (TEST_ScoringTableTest_NonDealerSelfDrawn_Test *this)

{
  pair<int,_int> pVar1;
  UtestShell *pUVar2;
  pair<int,_int> pVar3;
  char *pcVar4;
  char *pcVar5;
  undefined1 *this_00;
  int value;
  SimpleString local_48;
  SimpleString local_40;
  TestTerminatorWithoutExceptions local_38;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8;
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x1e);
  value = (int)&local_48;
  if (pVar1.first == 300) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x59,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x1e);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x1e);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x59);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x1e);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x59,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x1e);
  if (pVar1.second == 500) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x5a,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x1e);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x1e);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x5a);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x1e);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x5a,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x28);
  if (pVar1.first == 400) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x5b,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x28);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x28);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x5b);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x28);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x5b,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x28);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x2bc00000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x5c,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x28);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x28);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x5c);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x28);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x5c,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x32);
  if (pVar1.first == 400) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x5d,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x32);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x32);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x5d);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x32);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x5d,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x32);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x32000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x5e,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x32);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x32);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x5e);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x32);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x5e,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x3c);
  if (pVar1.first == 500) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x5f,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x3c);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x3c);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x5f);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x3c);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x5f,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x3c);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x3e800000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x60,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x3c);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x3c);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x60);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x3c);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x60,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x46);
  if (pVar1.first == 600) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x61,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x46);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x46);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x61);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x46);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x61,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x46);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x4b000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x62,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x46);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x46);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x62);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,1,0x46);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x62,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x14);
  if (pVar1.first == 400) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,100,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x14);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x14);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,100);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x14);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,100,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x14);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x2bc00000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x65,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x14);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x14);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x65);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x14);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x65,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x1e);
  if (pVar1.first == 500) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x66,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x1e);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x1e);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x66);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x1e);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x66,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x1e);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x3e800000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x67,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x1e);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x1e);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x67);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x1e);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x67,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x28);
  if (pVar1.first == 700) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x68,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x28);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x28);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x68);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x28);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x68,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x28);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x51400000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x69,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x28);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x28);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x69);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x28);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x69,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x32);
  if (pVar1.first == 800) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x6a,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x32);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x32);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x6a);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x32);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x6a,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x32);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x64000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x6b,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x32);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x32);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x6b);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x32);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x6b,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x3c);
  if (pVar1.first == 1000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x6c,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x3c);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x3c);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x6c);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x3c);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x6c,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x3c);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x7d000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x6d,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x3c);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x3c);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x6d);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x3c);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x6d,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x46);
  if (pVar1.first == 0x4b0) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x6e,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x46);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x46);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x6e);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x46);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x6e,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x46);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x8fc00000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x6f,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x46);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x46);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x6f);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,2,0x46);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x6f,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x14);
  if (pVar1.first == 700) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x71,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x14);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x14);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x71);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x14);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x71,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x14);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x51400000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x72,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x14);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x14);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x72);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x14);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x72,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x1e);
  if (pVar1.first == 1000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x73,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x1e);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x1e);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x73);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x1e);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x73,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x1e);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0x7d000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x74,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x1e);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x1e);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x74);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x1e);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x74,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x28);
  if (pVar1.first == 0x514) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x75,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x28);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x28);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x75);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x28);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x75,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x28);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0xa2800000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x76,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x28);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x28);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x76);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x28);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x76,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x32);
  if (pVar1.first == 0x640) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x77,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x32);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x32);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x77);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x32);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x77,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x32);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0xc8000000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x78,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x32);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x32);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x78);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x32);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x78,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x3c);
  if (pVar1.first == 2000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x79,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x3c);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x3c);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x79);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x3c);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x79,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x3c);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0xf3c00000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x7a,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x3c);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x3c);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x7a);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,3,0x3c);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x7a,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x14);
  if (pVar1.first == 0x514) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x7c,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x14);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x14);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x7c);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x14);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x7c,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x14);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0xa2800000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x7d,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x14);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x14);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x7d);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x14);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x7d,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x1e);
  if (pVar1.first == 2000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x7e,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x1e);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x1e);
    if (pVar1.first != pVar3.first) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x7e);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x1e);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x7e,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x1e);
  if (((ulong)pVar1 & 0xffffffff00000000) == 0xf3c00000000) {
    pUVar2 = UtestShell::getCurrent();
    local_48.buffer_ = (char *)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x7f,&local_48);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_48);
  }
  else {
    pVar1 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x1e);
    pVar3 = mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x1e);
    if (((ulong)pVar3 ^ (ulong)pVar1) >> 0x20 != 0) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x7f);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerSelfDrawn((ScoringTable *)this_00,4,0x1e);
    StringFrom((int)&local_40);
    pcVar5 = SimpleString::asCharString(&local_40);
    local_38.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x7f,&local_38);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_38);
    SimpleString::~SimpleString(&local_40);
    SimpleString::~SimpleString(&local_48);
  }
  return;
}

Assistant:

TEST(ScoringTableTest, NonDealerSelfDrawn)
{
	CHECK_EQUAL(300, t.nonDealerSelfDrawn(1, 30).first);
	CHECK_EQUAL(500, t.nonDealerSelfDrawn(1, 30).second);
	CHECK_EQUAL(400, t.nonDealerSelfDrawn(1, 40).first);
	CHECK_EQUAL(700, t.nonDealerSelfDrawn(1, 40).second);
	CHECK_EQUAL(400, t.nonDealerSelfDrawn(1, 50).first);
	CHECK_EQUAL(800, t.nonDealerSelfDrawn(1, 50).second);
	CHECK_EQUAL(500, t.nonDealerSelfDrawn(1, 60).first);
	CHECK_EQUAL(1000, t.nonDealerSelfDrawn(1, 60).second);
	CHECK_EQUAL(600, t.nonDealerSelfDrawn(1, 70).first);
	CHECK_EQUAL(1200, t.nonDealerSelfDrawn(1, 70).second);

	CHECK_EQUAL(400, t.nonDealerSelfDrawn(2, 20).first);
	CHECK_EQUAL(700, t.nonDealerSelfDrawn(2, 20).second);
	CHECK_EQUAL(500, t.nonDealerSelfDrawn(2, 30).first);
	CHECK_EQUAL(1000, t.nonDealerSelfDrawn(2, 30).second);
	CHECK_EQUAL(700, t.nonDealerSelfDrawn(2, 40).first);
	CHECK_EQUAL(1300, t.nonDealerSelfDrawn(2, 40).second);
	CHECK_EQUAL(800, t.nonDealerSelfDrawn(2, 50).first);
	CHECK_EQUAL(1600, t.nonDealerSelfDrawn(2, 50).second);
	CHECK_EQUAL(1000, t.nonDealerSelfDrawn(2, 60).first);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(2, 60).second);
	CHECK_EQUAL(1200, t.nonDealerSelfDrawn(2, 70).first);
	CHECK_EQUAL(2300, t.nonDealerSelfDrawn(2, 70).second);

	CHECK_EQUAL(700, t.nonDealerSelfDrawn(3, 20).first);
	CHECK_EQUAL(1300, t.nonDealerSelfDrawn(3, 20).second);
	CHECK_EQUAL(1000, t.nonDealerSelfDrawn(3, 30).first);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(3, 30).second);
	CHECK_EQUAL(1300, t.nonDealerSelfDrawn(3, 40).first);
	CHECK_EQUAL(2600, t.nonDealerSelfDrawn(3, 40).second);
	CHECK_EQUAL(1600, t.nonDealerSelfDrawn(3, 50).first);
	CHECK_EQUAL(3200, t.nonDealerSelfDrawn(3, 50).second);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(3, 60).first);
	CHECK_EQUAL(3900, t.nonDealerSelfDrawn(3, 60).second);

	CHECK_EQUAL(1300, t.nonDealerSelfDrawn(4, 20).first);
	CHECK_EQUAL(2600, t.nonDealerSelfDrawn(4, 20).second);
	CHECK_EQUAL(2000, t.nonDealerSelfDrawn(4, 30).first);
	CHECK_EQUAL(3900, t.nonDealerSelfDrawn(4, 30).second);
}